

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_subtract_sse2.c
# Opt level: O2

void aom_highbd_subtract_block_sse2
               (int rows,int cols,int16_t *diff,ptrdiff_t diff_stride,uint8_t *src8,
               ptrdiff_t src_stride,uint8_t *pred8,ptrdiff_t pred_stride)

{
  int iVar1;
  
  iVar1 = 0;
  if (rows != 0) {
    for (; ((uint)rows >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
    }
  }
  (*(code *)(&DAT_00468780 + *(int *)(&DAT_00468780 + (ulong)(iVar1 - 2) * 4)))
            (&DAT_00468780 + *(int *)(&DAT_00468780 + (ulong)(iVar1 - 2) * 4));
  return;
}

Assistant:

void aom_highbd_subtract_block_sse2(int rows, int cols, int16_t *diff,
                                    ptrdiff_t diff_stride, const uint8_t *src8,
                                    ptrdiff_t src_stride, const uint8_t *pred8,
                                    ptrdiff_t pred_stride) {
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  SubtractWxHFuncType func;

  func = getSubtractFunc(rows, cols);
  func(diff, diff_stride, src, src_stride, pred, pred_stride);
}